

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# botp.c
# Opt level: O0

err_t botpTOTPVerify(char *otp,octet *key,size_t key_len,tm_time_t t)

{
  bool_t bVar1;
  size_t sVar2;
  octet *state_00;
  size_t in_RCX;
  void *in_RDX;
  void *in_RSI;
  bool_t success;
  void *state;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  octet *key_00;
  err_t local_4;
  
  bVar1 = strIsValid(in_stack_ffffffffffffffc0);
  if (((bVar1 == 0) || (sVar2 = strLen((char *)0x15ac01), sVar2 < 6)) ||
     (sVar2 = strLen((char *)0x15ac11), 8 < sVar2)) {
    local_4 = 0x206;
  }
  else if (in_RCX == 0xffffffffffffffff) {
    local_4 = 0x133;
  }
  else {
    bVar1 = memIsValid(in_RSI,(size_t)in_RDX);
    if (bVar1 == 0) {
      local_4 = 0x6d;
    }
    else {
      botpTOTP_keep();
      state_00 = (octet *)blobCreate(in_stack_ffffffffffffffb8);
      if (state_00 == (octet *)0x0) {
        local_4 = 0x6e;
      }
      else {
        key_00 = state_00;
        strLen((char *)0x15ac92);
        botpTOTPStart(in_RDX,in_RCX,key_00,
                      CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        bVar1 = botpTOTPStepV((char *)key_00,
                              CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),state_00
                             );
        blobClose((blob_t)0x15accb);
        local_4 = 0x206;
        if (bVar1 != 0) {
          local_4 = 0;
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t botpTOTPVerify(const char* otp, const octet key[], size_t key_len, 
	tm_time_t t)
{
	void* state;
	bool_t success;
	// проверить входные данные
	if (!strIsValid(otp) || strLen(otp) < 6 || strLen(otp) > 8)
		return ERR_BAD_PWD;
	if (t == TIME_ERR)
		return ERR_BAD_TIME;
	if (!memIsValid(key, key_len))
		return ERR_BAD_INPUT;
	// создать состояние
	state = blobCreate(botpTOTP_keep());
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// проверить пароль
	botpTOTPStart(state, strLen(otp), key, key_len);
	success = botpTOTPStepV(otp, t, state);
	// завершить
	blobClose(state);
	return success ? ERR_OK : ERR_BAD_PWD;
}